

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O1

int Dch_DeriveChoiceCountReprs(Aig_Man_t *pAig)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Aig_Obj_t *pAVar5;
  
  lVar3 = (long)pAig->vObjs->nSize;
  if (lVar3 < 1) {
    iVar2 = 0;
  }
  else {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = pAig->vObjs->pArray[lVar4];
      if (pvVar1 != (void *)0x0) {
        if (pAig->pReprs == (Aig_Obj_t **)0x0) {
          pAVar5 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar5 = pAig->pReprs[*(int *)((long)pvVar1 + 0x24)];
        }
        if (pAVar5 != (Aig_Obj_t *)0x0) {
          if (*(int *)((long)pvVar1 + 0x24) <= pAVar5->Id) {
            __assert_fail("pRepr->Id < pObj->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchChoice.c"
                          ,0x54,"int Dch_DeriveChoiceCountReprs(Aig_Man_t *)");
          }
          iVar2 = iVar2 + 1;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return iVar2;
}

Assistant:

int Dch_DeriveChoiceCountReprs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj, * pRepr;
    int i, nReprs = 0;
    Aig_ManForEachObj( pAig, pObj, i )
    {
        pRepr = Aig_ObjRepr( pAig, pObj );
        if ( pRepr == NULL )
            continue;
        assert( pRepr->Id < pObj->Id );
        nReprs++;
    }
    return nReprs;
}